

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O1

char * borg_prepared(wchar_t depth)

{
  monster_race *pmVar1;
  _Bool _Var2;
  char *pcVar3;
  wchar_t wVar4;
  char *fmt;
  int iVar5;
  ulong uVar6;
  
  if (depth == L'\x01') {
    return (char *)0x0;
  }
  iVar5 = borg_cfg[0xd];
  pcVar3 = borg_restock(depth);
  if (iVar5 == 0) {
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    if (borg.trait[0x24] < depth && borg.trait[0x24] < L'2') {
      return "Clevel < depth";
    }
    if ((depth < L'd') && (pcVar3 = borg_prepared_aux(depth), pcVar3 != (char *)0x0)) {
      return pcVar3;
    }
    wVar4 = borg_cfg[0x10];
    if (wVar4 <= depth) {
      pcVar3 = "No deeper %d.";
      goto LAB_0023eeea;
    }
  }
  else {
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    pcVar3 = borg_prepared_dynamic(depth);
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
  }
  if (borg.trait[0x6b] != 0) {
    return (char *)0x0;
  }
  if (borg.trait[0x69] == 0) {
    return (char *)0x0;
  }
  if (L'Q' < depth) {
    if (((int)num_life + (int)num_ezheal < 10) && (borg.trait[0xd8] + borg.trait[0xd7] < 10)) {
      borg_notice_home((borg_item_conflict *)0x0,false);
      wVar4 = L'\n' - num_ezheal;
LAB_0023ef4e:
      pcVar3 = "Scumming *Heal* potions (%d to go).";
LAB_0023eeea:
      strnfmt(borg_prepared_buffer,0x400,pcVar3,(ulong)(uint)wVar4);
      return borg_prepared_buffer;
    }
    if (0x60 < borg.trait[0x6a]) {
      borg_notice_home((borg_item_conflict *)0x0,false);
      wVar4 = (int)num_life_true + (int)num_ezheal_true;
      iVar5 = wVar4 + borg.trait[0xd7] + borg.trait[0xd8];
      if (iVar5 < 0x1e) {
        wVar4 = L'\x1e' - iVar5;
        goto LAB_0023ef4e;
      }
      if ((0 < num_ezheal_true && borg.trait[0xd8] + borg.trait[0xd7] < 0x1e) &&
         (0x62 < borg.trait[0x6a])) {
        pcVar3 = "Collect from house (%d potions).";
        goto LAB_0023eeea;
      }
    }
  }
  pmVar1 = r_info;
  if (borg.trait[0x6a] < 99) {
    if (borg_cfg[0xb] == 0) {
      return (char *)0x0;
    }
    if (borg_numb_live_unique < L'\x03') {
      return (char *)0x0;
    }
    if (depth <= borg_depth_hunted_unique) {
      return (char *)0x0;
    }
    pcVar3 = r_info[borg_first_living_unique].name;
    fmt = "Must kill %s.";
LAB_0023f080:
    strnfmt(borg_prepared_buffer,0x400,fmt,pcVar3);
    return borg_prepared_buffer;
  }
  if (L'a' < depth) {
    uVar6 = (ulong)borg_first_living_unique;
    borg.ready_morgoth = L'\xffffffff';
    if ((borg_numb_live_unique < L'\x01') || (borg_first_living_unique == borg_morgoth_id)) {
      if (depth != L'b') {
        borg.ready_morgoth = L'\x01';
      }
    }
    else if ((depth != L'b' || borg.trait[0x6a] != 99) ||
            ((_Var2 = borg_spell_legal_fail(TELEPORT_LEVEL,L'\x14'), !_Var2 &&
             (borg.trait[0xf7] < 1)))) {
      pcVar3 = pmVar1[uVar6].name;
      fmt = "%s still alive!";
      goto LAB_0023f080;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *borg_prepared(int depth)
{
    const char *reason;

    /* Town and First level */
    if (depth == 1)
        return ((char *)NULL);

    if (borg_cfg[BORG_USES_DYNAMIC_CALCS]) {

        /* use the base restock so special checks can be done */
        if ((reason = borg_restock(depth)))
            return reason;

        if ((reason = borg_prepared_dynamic(depth)))
            return reason;

    } else {
        /* Not prepared if I need to restock */
        if ((reason = borg_restock(depth)))
            return (reason);

        /*** Require his Clevel to be greater than or equal to Depth */
        if (borg.trait[BI_MAXCLEVEL] < depth && borg.trait[BI_MAXCLEVEL] < 50)
            return ("Clevel < depth");

        /* Must meet minimal requirements */
        if (depth <= 99) {
            if ((reason = borg_prepared_aux(depth)))
                return (reason);
        }

        /* Not if No_Deeper is set */
        if (depth >= borg_cfg[BORG_NO_DEEPER]) {
            strnfmt(borg_prepared_buffer, MAX_REASON, "No deeper %d.",
                borg_cfg[BORG_NO_DEEPER]);
            return (borg_prepared_buffer);
        }
    }

    /* Once Morgoth is dead */
    if (borg.trait[BI_KING]) {
        return ((char *)NULL);
    }

    /* Always okay from town */
    if (!borg.trait[BI_CDEPTH])
        return (reason);

    /* Scum on depth 80-81 for some *heal* potions */
    if (depth >= 82
        && ((num_ezheal + num_life) < 10
            && (borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 10)) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        strnfmt(borg_prepared_buffer, MAX_REASON,
            "Scumming *Heal* potions (%d to go).", 10 - num_ezheal);
        return (borg_prepared_buffer);
    }

    /* Scum on depth 80-81 for lots of *Heal* potions preparatory for Endgame */
    if (depth >= 82 && borg.trait[BI_MAXDEPTH] >= 97) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        /* Scum for 30*/
        int heals = num_ezheal_true + borg.trait[BI_AEZHEAL] + num_life_true
                    + borg.trait[BI_ALIFE];
        if (heals < 30) {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Scumming *Heal* potions (%d to go).",
                30 - heals);
            return (borg_prepared_buffer);
        }

        /* Return to town to get your stock from the home */
        if ((borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 30 && heals >= 30
            && num_ezheal_true >= 1 && borg.trait[BI_MAXDEPTH] >= 99)
        {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Collect from house (%d potions).",
                num_ezheal_true + num_life_true);
            return (borg_prepared_buffer);
        }
    }

    /* Check to make sure the borg does not go below where 3 living */
    /* uniques are. */
    if (borg.trait[BI_MAXDEPTH] <= 98) {
        struct monster_race *r_ptr;

        /* don't check how many uniques are alive */
        if (borg_cfg[BORG_KILLS_UNIQUES] == false)
            return ((char *)NULL);

        /* are too many uniques alive */
        if (borg_numb_live_unique < 3)
            return ((char *)NULL);

        /* Check for the dlevel of the unique */
        if (depth <= borg_depth_hunted_unique)
            return ((char *)NULL);

        /* To avoid double calls to format() */
        /* Reset our description for not diving */
        r_ptr = &r_info[borg_first_living_unique];
        strnfmt(borg_prepared_buffer, MAX_REASON, "Must kill %s.", r_ptr->name);
        return (borg_prepared_buffer);

    } else if (borg.trait[BI_MAXDEPTH] >= 98 && depth >= 98)
    /* check to make sure the borg does not go to level 100 */
    /* unless all the uniques are dead. */
    {
        struct monster_race *r_ptr;

        /* Access the living unique obtained from borg_update() */
        r_ptr = &r_info[borg_first_living_unique];

        /* -1 is unknown. */
        borg.ready_morgoth = -1;

        /* is only Morgoth alive? */
        if (borg_numb_live_unique < 1
            || borg_first_living_unique == borg_morgoth_id)
        {
            if (depth >= 99)
                borg.ready_morgoth = 1;
            return ((char *)NULL);
        }

        /* Under special cases allow the borg to dive to 99 then quickly
         * get his butt to dlevel 98
         */
        if (borg.trait[BI_MAXDEPTH] == 99 && depth <= 98
            && (borg_spell_legal_fail(TELEPORT_LEVEL, 20)
                || /* Teleport Level */
                borg.trait[BI_ATELEPORTLVL] >= 1)) /* Teleport Level scroll */
        {
            return ((char *)NULL);
        }

        /* To avoid double calls to format() */
        strnfmt(
            borg_prepared_buffer, MAX_REASON, "%s still alive!", r_ptr->name);
        return (borg_prepared_buffer);
    }
    return (char *)NULL;
}